

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String testing::internal::GetBoolAssertionFailureMessage
                 (AssertionResult *assertion_result,char *expression_text,
                 char *actual_predicate_value,char *expected_predicate_value)

{
  Message *this;
  Message *this_00;
  size_t extraout_RDX;
  String SVar1;
  AssertionResult *in_stack_ffffffffffffff70;
  Message *in_stack_ffffffffffffff78;
  Message *in_stack_ffffffffffffff80;
  Message local_40;
  Message msg;
  char *actual_message;
  char *expected_predicate_value_local;
  char *actual_predicate_value_local;
  char *expression_text_local;
  AssertionResult *assertion_result_local;
  
  msg.ss_.ptr_ = (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )AssertionResult::message(in_stack_ffffffffffffff70);
  Message::Message(in_stack_ffffffffffffff80);
  Message::operator<<(&local_40,(char (*) [11])"Value of: ");
  Message::operator<<(in_stack_ffffffffffffff80,(char **)in_stack_ffffffffffffff78);
  this = Message::operator<<(in_stack_ffffffffffffff80,(char (*) [12])in_stack_ffffffffffffff78);
  Message::operator<<(this,(char **)in_stack_ffffffffffffff78);
  if (*(char *)msg.ss_.ptr_ != '\0') {
    in_stack_ffffffffffffff78 = Message::operator<<(&local_40,(char (*) [3])0x17c4de);
    this_00 = Message::operator<<(this,(char **)in_stack_ffffffffffffff78);
    Message::operator<<(this_00,(char (*) [2])0x17c3d3);
  }
  Message::operator<<(this,(char (*) [12])in_stack_ffffffffffffff78);
  Message::operator<<(this,(char **)in_stack_ffffffffffffff78);
  Message::GetString(in_stack_ffffffffffffff78);
  Message::~Message((Message *)0x153fdb);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = &assertion_result->success_;
  return SVar1;
}

Assistant:

String GetBoolAssertionFailureMessage(const AssertionResult& assertion_result,
                                      const char* expression_text,
                                      const char* actual_predicate_value,
                                      const char* expected_predicate_value) {
  const char* actual_message = assertion_result.message();
  Message msg;
  msg << "Value of: " << expression_text
      << "\n  Actual: " << actual_predicate_value;
  if (actual_message[0] != '\0')
    msg << " (" << actual_message << ")";
  msg << "\nExpected: " << expected_predicate_value;
  return msg.GetString();
}